

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,REF_BOOL *manifold)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  REF_GRID pRVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  REF_BOOL contains;
  REF_INT cell;
  REF_INT nodes [27];
  uint local_bc;
  int local_b8;
  int local_b4;
  REF_BOOL *local_b0;
  int local_a8;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  
  *manifold = 0;
  iVar6 = ref_cavity->surf_node;
  if (iVar6 == -1) {
    iVar6 = ref_cavity->node;
  }
  pRVar4 = ref_cavity->ref_grid;
  local_b0 = manifold;
  if (0 < ref_cavity->maxseg) {
    pRVar1 = pRVar4->cell[3];
    lVar7 = 8;
    lVar8 = 0;
    do {
      pRVar2 = ref_cavity->s2n;
      local_a8 = *(int *)((long)pRVar2 + lVar7 + -8);
      if ((iVar6 != local_a8 && local_a8 != -1) && (iVar6 != *(int *)((long)pRVar2 + lVar7 + -4))) {
        local_a4 = *(undefined4 *)((long)pRVar2 + lVar7 + -4);
        local_9c = *(int *)((long)pRVar2 + lVar7);
        local_a0 = iVar6;
        uVar3 = ref_cell_with(pRVar1,&local_a8,&local_b4);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x6ae,"ref_cavity_manifold",(ulong)uVar3,"with manifold search failed");
          local_bc = uVar3;
        }
        if ((uVar3 != 5) && (uVar3 != 0)) {
          return local_bc;
        }
        if (local_b4 != -1) {
          uVar3 = ref_list_contains(ref_cavity->tri_list,local_b4,&local_b8);
          if (uVar3 != 0) {
            uVar5 = 0x6b1;
            goto LAB_0015b2f4;
          }
          if (local_b8 == 0) goto LAB_0015b299;
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar8 < ref_cavity->maxseg);
    pRVar4 = ref_cavity->ref_grid;
  }
  if (0 < ref_cavity->maxface) {
    iVar6 = ref_cavity->node;
    pRVar1 = pRVar4->cell[8];
    lVar7 = 8;
    lVar8 = 0;
    do {
      pRVar2 = ref_cavity->f2n;
      local_a8 = *(int *)((long)pRVar2 + lVar7 + -8);
      if (((iVar6 != local_a8 && local_a8 != -1) && (iVar6 != *(int *)((long)pRVar2 + lVar7 + -4)))
         && (iVar6 != *(int *)((long)pRVar2 + lVar7))) {
        local_a4 = *(undefined4 *)((long)pRVar2 + lVar7 + -4);
        local_a0 = *(int *)((long)pRVar2 + lVar7);
        local_9c = iVar6;
        uVar3 = ref_cell_with(pRVar1,&local_a8,&local_b4);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x6c8,"ref_cavity_manifold",(ulong)uVar3,"with manifold search failed");
          local_bc = uVar3;
        }
        if ((uVar3 != 5) && (uVar3 != 0)) {
          return local_bc;
        }
        if (local_b4 != -1) {
          uVar3 = ref_list_contains(ref_cavity->tet_list,local_b4,&local_b8);
          if (uVar3 != 0) {
            uVar5 = 0x6cb;
LAB_0015b2f4:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar5,"ref_cavity_manifold",(ulong)uVar3,"contains a plan to remove");
            return uVar3;
          }
          if (local_b8 == 0) {
LAB_0015b299:
            *local_b0 = 0;
            return 0;
          }
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar8 < ref_cavity->maxface);
  }
  *local_b0 = 1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_manifold(REF_CAVITY ref_cavity,
                                              REF_BOOL *manifold) {
  REF_INT node;
  REF_CELL ref_cell;
  REF_INT seg, face;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL contains;

  *manifold = REF_FALSE;

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    /* skip a seg attached to node */
    if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
        node == ref_cavity_s2n(ref_cavity, 1, seg))
      continue;

    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    /* skip a face attached to node */
    if (node == ref_cavity_f2n(ref_cavity, 0, face) ||
        node == ref_cavity_f2n(ref_cavity, 1, face) ||
        node == ref_cavity_f2n(ref_cavity, 2, face))
      continue;

    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;

    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND,
        "with manifold search failed");
    if (REF_EMPTY != cell) {
      RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell, &contains),
          "contains a plan to remove");
      if (!contains) {
        *manifold = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  *manifold = REF_TRUE;

  return REF_SUCCESS;
}